

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O3

int gost_keg(uchar *ukm_source,int pkey_nid,EC_POINT *pub_key,EC_KEY *priv_key,uchar *keyout)

{
  int iVar1;
  undefined1 auVar2 [16];
  uchar real_ukm [16];
  uchar tmpkey [32];
  
  auVar2[0] = -(*ukm_source == '\0');
  auVar2[1] = -(ukm_source[1] == '\0');
  auVar2[2] = -(ukm_source[2] == '\0');
  auVar2[3] = -(ukm_source[3] == '\0');
  auVar2[4] = -(ukm_source[4] == '\0');
  auVar2[5] = -(ukm_source[5] == '\0');
  auVar2[6] = -(ukm_source[6] == '\0');
  auVar2[7] = -(ukm_source[7] == '\0');
  auVar2[8] = -(ukm_source[8] == '\0');
  auVar2[9] = -(ukm_source[9] == '\0');
  auVar2[10] = -(ukm_source[10] == '\0');
  auVar2[0xb] = -(ukm_source[0xb] == '\0');
  auVar2[0xc] = -(ukm_source[0xc] == '\0');
  auVar2[0xd] = -(ukm_source[0xd] == '\0');
  auVar2[0xe] = -(ukm_source[0xe] == '\0');
  auVar2[0xf] = -(ukm_source[0xf] == '\0');
  if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf) ==
      0xffff) {
    real_ukm._0_15_ = SUB1615((undefined1  [16])0x0,0);
    real_ukm[0xf] = '\x01';
  }
  else {
    real_ukm = *(uchar (*) [16])ukm_source;
    BUF_reverse(real_ukm,(uchar *)0x0,0x10);
  }
  if (pkey_nid == 0x3d3) {
    iVar1 = VKO_compute_key(tmpkey,pub_key,priv_key,real_ukm,0x10,0x3d6);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = gost_kdftree2012_256
                        (keyout,0x40,tmpkey,0x20,(uchar *)"kdf tree",8,ukm_source + 0x10,8,1);
      iVar1 = (uint)(0 < iVar1) << 6;
      OPENSSL_cleanse(tmpkey,0x20);
    }
  }
  else {
    iVar1 = 0;
    if (pkey_nid == 0x3d4) {
      iVar1 = VKO_compute_key(keyout,pub_key,priv_key,real_ukm,0x10,0x3d7);
    }
  }
  return iVar1;
}

Assistant:

static int gost_keg(const unsigned char *ukm_source, int pkey_nid,
                    const EC_POINT *pub_key, const EC_KEY *priv_key,
                    unsigned char *keyout)
{
/* Adjust UKM */
    unsigned char real_ukm[16];
    size_t keylen = 0;

    memset(real_ukm, 0, 16);
    if (memcmp(ukm_source, real_ukm, 16) == 0)
        real_ukm[15] = 1;
    else {
        memcpy(real_ukm, ukm_source, 16);
        BUF_reverse(real_ukm, NULL, 16);
    }

    switch (pkey_nid) {
    case NID_id_GostR3410_2012_512:
        keylen =
            VKO_compute_key(keyout, pub_key, priv_key, real_ukm, 16,
                            NID_id_GostR3411_2012_512);
        return (keylen) ? keylen : 0;
        break;

    case NID_id_GostR3410_2012_256:
        {
            unsigned char tmpkey[32];
            keylen =
              VKO_compute_key(tmpkey, pub_key, priv_key, real_ukm, 16,
                  NID_id_GostR3411_2012_256);

            if (keylen == 0)
                return 0;

            if (gost_kdftree2012_256
                (keyout, 64, tmpkey, 32, (const unsigned char *)"kdf tree", 8,
                 ukm_source + 16, 8, 1) > 0)
                keylen = 64;
            else
                keylen = 0;

            OPENSSL_cleanse(tmpkey, 32);
            return (keylen) ? keylen : 0;
        }
    default:
        return 0;
    }
}